

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_ary_search_set.hpp
# Opt level: O0

void __thiscall
burst::k_ary_search_set<long,std::less<void>>::
initialize_trusted<boost::iterator_range<__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>>>
          (k_ary_search_set<long,std::less<void>> *this,
          iterator_range<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>_>
          *range)

{
  size_t sVar1;
  value_type vVar2;
  size_t sVar3;
  ulong uVar4;
  bool bVar5;
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> _Var6;
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> _Var7;
  size_type __new_size;
  size_type size;
  reference pvVar8;
  reference pvVar9;
  size_type sVar10;
  value_type local_148;
  ulong local_128;
  size_t i;
  value_type local_118;
  size_t local_110;
  size_t local_108;
  undefined1 local_100 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> counters;
  value_type branch;
  value_type local_b0;
  undefined1 local_90 [8];
  stack<burst::k_ary_search_set_branch,_std::deque<burst::k_ary_search_set_branch,_std::allocator<burst::k_ary_search_set_branch>_>_>
  branches;
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> local_20;
  iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::incrementable_traversal_tag>
  *local_18;
  iterator_range<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>_>
  *range_local;
  k_ary_search_set<long,_std::less<void>_> *this_local;
  
  local_18 = (iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::incrementable_traversal_tag>
              *)range;
  range_local = (iterator_range<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>_>
                 *)this;
  _Var6 = boost::iterator_range_detail::
          iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::incrementable_traversal_tag>
          ::begin((iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::incrementable_traversal_tag>
                   *)range);
  _Var7 = boost::iterator_range_detail::
          iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::incrementable_traversal_tag>
          ::end(local_18);
  not_fn<std::less<void>&>((less<void> *)(this + 0x20));
  local_20 = std::
             adjacent_find<__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>,burst::not_fn_t<std::less<void>>>
                       (_Var6._M_current,_Var7._M_current);
  branches.c.
  super__Deque_base<burst::k_ary_search_set_branch,_std::allocator<burst::k_ary_search_set_branch>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node =
       (_Map_pointer)
       boost::iterator_range_detail::
       iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::incrementable_traversal_tag>
       ::end(local_18);
  bVar5 = __gnu_cxx::operator==
                    (&local_20,
                     (__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> *)
                     &branches.c.
                      super__Deque_base<burst::k_ary_search_set_branch,_std::allocator<burst::k_ary_search_set_branch>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node);
  if (!bVar5) {
    __assert_fail("std::adjacent_find(range.begin(), range.end(), burst::not_fn(m_compare)) == range.end()"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/container/k_ary_search_set.hpp"
                  ,0x149,
                  "void burst::k_ary_search_set<long>::initialize_trusted(const RandomAccessRange &) [Value = long, Compare = std::less<void>, RandomAccessRange = boost::iterator_range<__gnu_cxx::__normal_iterator<const long *, std::vector<long>>>]"
                 );
  }
  bVar5 = boost::iterator_range_detail::
          iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::incrementable_traversal_tag>
          ::empty(local_18);
  if (!bVar5) {
    __new_size = boost::iterator_range_detail::
                 iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::random_access_traversal_tag>
                 ::size((iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::random_access_traversal_tag>
                         *)local_18);
    std::vector<long,_std::allocator<long>_>::resize
              ((vector<long,_std::allocator<long>_> *)this,__new_size);
    std::
    stack<burst::k_ary_search_set_branch,std::deque<burst::k_ary_search_set_branch,std::allocator<burst::k_ary_search_set_branch>>>
    ::
    stack<std::deque<burst::k_ary_search_set_branch,std::allocator<burst::k_ary_search_set_branch>>,void>
              ((stack<burst::k_ary_search_set_branch,std::deque<burst::k_ary_search_set_branch,std::allocator<burst::k_ary_search_set_branch>>>
                *)local_90);
    local_b0.index = 0;
    local_b0.size =
         k_ary_search_set<long,_std::less<void>_>::size
                   ((k_ary_search_set<long,_std::less<void>_> *)this);
    sVar1 = *(size_t *)(this + 0x18);
    size = k_ary_search_set<long,_std::less<void>_>::size
                     ((k_ary_search_set<long,_std::less<void>_> *)this);
    local_b0.height = k_ary_search_set<long,_std::less<void>_>::perfect_tree_height(sVar1,size);
    local_b0.preceding_elements = 0;
    std::
    stack<burst::k_ary_search_set_branch,_std::deque<burst::k_ary_search_set_branch,_std::allocator<burst::k_ary_search_set_branch>_>_>
    ::push((stack<burst::k_ary_search_set_branch,_std::deque<burst::k_ary_search_set_branch,_std::allocator<burst::k_ary_search_set_branch>_>_>
            *)local_90,&local_b0);
    while( true ) {
      bVar5 = std::
              stack<burst::k_ary_search_set_branch,_std::deque<burst::k_ary_search_set_branch,_std::allocator<burst::k_ary_search_set_branch>_>_>
              ::empty((stack<burst::k_ary_search_set_branch,_std::deque<burst::k_ary_search_set_branch,_std::allocator<burst::k_ary_search_set_branch>_>_>
                       *)local_90);
      if (((bVar5 ^ 0xffU) & 1) == 0) break;
      pvVar8 = std::
               stack<burst::k_ary_search_set_branch,_std::deque<burst::k_ary_search_set_branch,_std::allocator<burst::k_ary_search_set_branch>_>_>
               ::top((stack<burst::k_ary_search_set_branch,_std::deque<burst::k_ary_search_set_branch,_std::allocator<burst::k_ary_search_set_branch>_>_>
                      *)local_90);
      counters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)pvVar8->index;
      sVar1 = pvVar8->height;
      sVar3 = pvVar8->preceding_elements;
      std::
      stack<burst::k_ary_search_set_branch,_std::deque<burst::k_ary_search_set_branch,_std::allocator<burst::k_ary_search_set_branch>_>_>
      ::pop((stack<burst::k_ary_search_set_branch,_std::deque<burst::k_ary_search_set_branch,_std::allocator<burst::k_ary_search_set_branch>_>_>
             *)local_90);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_100);
      k_ary_search_set<long,_std::less<void>_>::fill_counters
                ((k_ary_search_set<long,_std::less<void>_> *)this,
                 (k_ary_search_set_branch *)
                 &counters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_100);
      fill_node<boost::iterator_range<__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>>>
                (this,(k_ary_search_set_branch *)
                      &counters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_100,
                 (iterator_range<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>_>
                  *)local_18);
      pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_100,0);
      if (*pvVar9 != 0) {
        i = k_ary_search_set<long,_std::less<void>_>::perfect_tree_child_index
                      (*(size_t *)(this + 0x18),
                       (size_t)counters.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,0);
        pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_100,0);
        local_118 = *pvVar9;
        local_110 = sVar1 - 1;
        local_108 = sVar3;
        std::
        stack<burst::k_ary_search_set_branch,_std::deque<burst::k_ary_search_set_branch,_std::allocator<burst::k_ary_search_set_branch>_>_>
        ::push((stack<burst::k_ary_search_set_branch,_std::deque<burst::k_ary_search_set_branch,_std::allocator<burst::k_ary_search_set_branch>_>_>
                *)local_90,(value_type *)&i);
      }
      local_128 = 1;
      while( true ) {
        uVar4 = local_128;
        sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_100);
        bVar5 = false;
        if (uVar4 < sVar10) {
          pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_100,
                              local_128);
          vVar2 = *pvVar9;
          pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_100,
                              local_128 - 1);
          bVar5 = vVar2 - *pvVar9 != 1;
        }
        if (!bVar5) break;
        local_148.index =
             k_ary_search_set<long,_std::less<void>_>::perfect_tree_child_index
                       (*(size_t *)(this + 0x18),
                        (size_t)counters.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,local_128);
        pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_100,
                            local_128);
        vVar2 = *pvVar9;
        pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_100,
                            local_128 - 1);
        local_148.size = ~*pvVar9 + vVar2;
        local_148.height = sVar1 - 1;
        pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_100,
                            local_128 - 1);
        local_148.preceding_elements = sVar3 + 1 + *pvVar9;
        std::
        stack<burst::k_ary_search_set_branch,_std::deque<burst::k_ary_search_set_branch,_std::allocator<burst::k_ary_search_set_branch>_>_>
        ::push((stack<burst::k_ary_search_set_branch,_std::deque<burst::k_ary_search_set_branch,_std::allocator<burst::k_ary_search_set_branch>_>_>
                *)local_90,&local_148);
        local_128 = local_128 + 1;
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_100);
    }
    std::
    stack<burst::k_ary_search_set_branch,_std::deque<burst::k_ary_search_set_branch,_std::allocator<burst::k_ary_search_set_branch>_>_>
    ::~stack((stack<burst::k_ary_search_set_branch,_std::deque<burst::k_ary_search_set_branch,_std::allocator<burst::k_ary_search_set_branch>_>_>
              *)local_90);
  }
  return;
}

Assistant:

void initialize_trusted (const RandomAccessRange & range)
        {
            BOOST_ASSERT
            (
                std::adjacent_find(range.begin(), range.end(), burst::not_fn(m_compare)) == range.end()
            );
            if (not range.empty())
            {
                m_values.resize(range.size());

                std::stack<k_ary_search_set_branch> branches;

                branches.push({0, size(), perfect_tree_height(m_arity, size()), 0});
                while (not branches.empty())
                {
                    const auto branch = branches.top();
                    branches.pop();

                    // Количество меньших элементов ветки для каждого элемента текущего узла.
                    std::vector<std::size_t> counters;
                    fill_counters(branch, counters);

                    fill_node(branch, counters, range);

                    if (counters[0] > 0)
                    {
                        branches.push
                        ({
                            perfect_tree_child_index(m_arity, branch.index, 0),
                            counters[0],
                            branch.height - 1,
                            branch.preceding_elements
                        });
                    }

                    for
                    (
                        std::size_t i = 1;
                        i < counters.size() && (counters[i] - counters[i - 1] - 1) > 0;
                        ++i
                    )
                    {
                        branches.push
                        ({
                            perfect_tree_child_index(m_arity, branch.index, i),
                            counters[i] - counters[i - 1] - 1,
                            branch.height - 1,
                            branch.preceding_elements + counters[i - 1] + 1
                        });
                    }
                }
            }
        }